

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyInstance.cpp
# Opt level: O2

void Js::WebAssemblyInstance::ValidateTableAndMemory
               (WebAssemblyModule *wasmModule,ScriptContext *ctx,WebAssemblyEnvironment *env)

{
  WebAssemblyTable *table;
  WebAssemblyMemory *mem;
  ArrayBufferBase *pAVar1;
  int32 hCode;
  
  table = WebAssemblyEnvironment::GetTable(env,0);
  if ((wasmModule->m_tableImport).ptr == (WasmImport *)0x0) {
    table = WebAssemblyModule::CreateTable(wasmModule);
    WebAssemblyEnvironment::SetTable(env,0,table);
  }
  else if (table == (WebAssemblyTable *)0x0) {
    hCode = -0x7ff5e49c;
    goto LAB_00c19791;
  }
  mem = WebAssemblyEnvironment::GetMemory(env,0);
  if ((wasmModule->m_memImport).ptr == (WasmImport *)0x0) {
    mem = WebAssemblyModule::CreateMemory(wasmModule);
    if (mem != (WebAssemblyMemory *)0x0) {
      WebAssemblyEnvironment::SetMemory(env,0,mem);
      goto LAB_00c19744;
    }
    hCode = -0x7ff5e490;
  }
  else {
    if (mem != (WebAssemblyMemory *)0x0) {
LAB_00c19744:
      pAVar1 = WebAssemblyMemory::GetBuffer(mem);
      if (pAVar1->isDetached != true) {
        WebAssemblyEnvironment::CalculateOffsets(env,table,mem);
        return;
      }
      JavascriptError::ThrowTypeError
                ((((((wasmModule->super_DynamicObject).super_RecyclableObject.type.ptr)->
                   javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                 -0x7ff5ebe5,(PCWSTR)0x0);
    }
    hCode = -0x7ff5e4a0;
  }
LAB_00c19791:
  JavascriptError::ThrowWebAssemblyLinkError(ctx,hCode,(PCWSTR)0x0);
}

Assistant:

void WebAssemblyInstance::ValidateTableAndMemory(WebAssemblyModule * wasmModule, ScriptContext* ctx, WebAssemblyEnvironment* env)
{
    WebAssemblyTable* table = env->GetTable(0);
    if (wasmModule->HasTableImport())
    {
        if (table == nullptr)
        {
            JavascriptError::ThrowWebAssemblyLinkError(ctx, WASMERR_NeedTableObject);
        }
    }
    else
    {
        table = wasmModule->CreateTable();
        env->SetTable(0, table);
    }

    WebAssemblyMemory* mem = env->GetMemory(0);
    if (wasmModule->HasMemoryImport())
    {
        if (mem == nullptr)
        {
            JavascriptError::ThrowWebAssemblyLinkError(ctx, WASMERR_NeedMemoryObject);
        }
    }
    else
    {
        mem = wasmModule->CreateMemory();
        if (mem == nullptr)
        {
            JavascriptError::ThrowWebAssemblyLinkError(ctx, WASMERR_MemoryCreateFailed);
        }
        env->SetMemory(0, mem);
    }
    ArrayBufferBase * buffer = mem->GetBuffer();
    if (buffer->IsDetached())
    {
        JavascriptError::ThrowTypeError(wasmModule->GetScriptContext(), JSERR_DetachedTypedArray);
    }

    env->CalculateOffsets(table, mem);
}